

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void ScanDirectoryFiles(char *basePath,FilePathList *files,char *filter)

{
  _Bool _Var1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  
  memset(ScanDirectoryFiles::path,0,0x1000);
  __dirp = opendir(basePath);
  if (__dirp == (DIR *)0x0) {
    TraceLog(4,"FILEIO: Directory cannot be opened (%s)",basePath);
    return;
  }
LAB_0016050f:
  while( true ) {
    do {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) {
        closedir(__dirp);
        return;
      }
    } while ((pdVar3->d_name[0] == '.') &&
            ((pdVar3->d_name[1] == '\0' ||
             ((pdVar3->d_name[1] == '.' && (pdVar3->d_name[2] == '\0'))))));
    sprintf(ScanDirectoryFiles::path,"%s/%s",basePath,pdVar3->d_name);
    if (filter == (char *)0x0) break;
    _Var1 = IsPathFile(ScanDirectoryFiles::path);
    if (!_Var1) goto LAB_00160571;
    _Var1 = IsFileExtension(ScanDirectoryFiles::path,filter);
    if (_Var1) break;
  }
  goto LAB_00160584;
LAB_00160571:
  iVar2 = TextFindIndex(filter,"DIR");
  if (-1 < iVar2) {
LAB_00160584:
    strcpy(files->paths[files->count],ScanDirectoryFiles::path);
    files->count = files->count + 1;
  }
  goto LAB_0016050f;
}

Assistant:

static void ScanDirectoryFiles(const char *basePath, FilePathList *files, const char *filter)
{
    static char path[MAX_FILEPATH_LENGTH] = { 0 };
    memset(path, 0, MAX_FILEPATH_LENGTH);

    struct dirent *dp = NULL;
    DIR *dir = opendir(basePath);

    if (dir != NULL)
    {
        while ((dp = readdir(dir)) != NULL)
        {
            if ((strcmp(dp->d_name, ".") != 0) &&
                (strcmp(dp->d_name, "..") != 0))
            {
            #if defined(_WIN32)
                sprintf(path, "%s\\%s", basePath, dp->d_name);
            #else
                sprintf(path, "%s/%s", basePath, dp->d_name);
            #endif

                if (filter != NULL)
                {
                    if (IsPathFile(path))
                    {
                        if (IsFileExtension(path, filter))
                        {
                            strcpy(files->paths[files->count], path);
                            files->count++;
                        }
                    }
                    else
                    {
                        if (TextFindIndex(filter, DIRECTORY_FILTER_TAG) >= 0)
                        {
                            strcpy(files->paths[files->count], path);
                            files->count++;
                        }
                    }
                }
                else
                {
                    strcpy(files->paths[files->count], path);
                    files->count++;
                }
            }
        }

        closedir(dir);
    }
    else TRACELOG(LOG_WARNING, "FILEIO: Directory cannot be opened (%s)", basePath);
}